

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool QObject::disconnect(QObject *sender,char *signal,QObject *receiver,char *method)

{
  QArgumentType *__s;
  byte bVar1;
  Data *pDVar2;
  qsizetype qVar3;
  QArgumentType *__s_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  QMetaObject *m;
  char *method_00;
  byte *pbVar10;
  char *pcVar11;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView name_00;
  QMetaObject *smeta;
  QArrayDataPointer<char> local_328;
  QArrayDataPointer<char> local_308;
  undefined1 local_2f0 [344];
  undefined1 local_198 [24];
  QArgumentType local_180 [10];
  long local_38;
  undefined4 extraout_var_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) || (method != (char *)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0) {
      bVar4 = false;
    }
    else {
      local_198._0_4_ = 2;
      local_198._4_4_ = 0;
      local_198._8_4_ = 0;
      local_198._12_4_ = 0;
      local_198._16_4_ = 0;
      local_198._20_4_ = 0;
      local_180[0]._metaType.d_ptr = (QMetaTypeInterface *)lcConnect::category.name;
      bVar4 = false;
      QMessageLogger::warning
                ((QMessageLogger *)local_198,"QObject::disconnect: Unexpected nullptr parameter");
    }
    goto LAB_0028cb50;
  }
  local_308.d = (Data *)0x0;
  local_308.ptr = (char *)0x0;
  local_308.size = 0;
  if (signal == (char *)0x0) {
    pcVar11 = (char *)0x0;
LAB_0028c78a:
    local_328.size = 0;
    local_328.d = (Data *)0x0;
    local_328.ptr = (char *)0x0;
    if (method == (char *)0x0) {
      pbVar10 = (byte *)0x0;
LAB_0028c832:
      iVar7 = (**sender->_vptr_QObject)();
      smeta = (QMetaObject *)CONCAT44(extraout_var,iVar7);
      __s_00 = local_180;
      memset(__s_00,0xaa,0x140);
      local_198._0_4_ = 10;
      local_198._4_4_ = 0;
      local_198._8_4_ = 0;
      local_198._12_4_ = 0;
      if (pcVar11 == (char *)0x0) {
        name = (QByteArrayView)ZEXT816(0);
      }
      else {
        local_198._16_8_ = __s_00;
        name = QMetaObjectPrivate::decodeMethodSignature(pcVar11,(QArgumentTypeArray *)local_198);
        __s_00 = (QArgumentType *)local_198._16_8_;
      }
      __s = (QArgumentType *)(local_2f0 + 0x18);
      local_198._16_8_ = __s_00;
      memset(__s,0xaa,0x140);
      local_2f0._0_8_ = 10;
      local_2f0._8_8_ = 0;
      local_2f0._16_8_ = __s;
      if (pbVar10 == (byte *)0x0) {
        name_00 = (QByteArrayView)ZEXT816(0);
      }
      else {
        name_00 = QMetaObjectPrivate::decodeMethodSignature
                            ((char *)pbVar10,(QArgumentTypeArray *)local_2f0);
      }
      bVar4 = false;
      bVar1 = 0;
      bVar5 = false;
      do {
        if (pcVar11 == (char *)0x0) {
          iVar7 = -1;
        }
        else {
          iVar7 = QMetaObjectPrivate::indexOfSignalRelative
                            (&smeta,name,local_198._8_4_,(QArgumentType *)local_198._16_8_);
          if (iVar7 < 0) break;
          iVar8 = QMetaObjectPrivate::originalClone(smeta,iVar7);
          iVar7 = QMetaObjectPrivate::signalOffset(smeta);
          iVar7 = iVar7 + iVar8;
          bVar5 = true;
        }
        if (pbVar10 == (byte *)0x0) {
          bVar6 = QMetaObjectPrivate::disconnect
                            (sender,iVar7,smeta,receiver,-1,(void **)0x0,DisconnectAll);
          bVar4 = (bool)(bVar4 | bVar6);
        }
        else {
          iVar8 = (**receiver->_vptr_QObject)(receiver);
          m = (QMetaObject *)CONCAT44(extraout_var_00,iVar8);
          do {
            iVar8 = QMetaObjectPrivate::indexOfMethod
                              (m,name_00,local_2f0._8_4_,(QArgumentType *)local_2f0._16_8_);
            if (iVar8 < 0) break;
            while( true ) {
              iVar9 = QMetaObject::methodOffset(m);
              if (iVar9 <= iVar8) break;
              m = (m->d).superdata.direct;
            }
            bVar6 = QMetaObjectPrivate::disconnect
                              (sender,iVar7,smeta,receiver,iVar8,(void **)0x0,DisconnectAll);
            bVar4 = (bool)(bVar4 | bVar6);
            m = (m->d).superdata.direct;
            bVar1 = 1;
          } while (m != (QMetaObject *)0x0);
        }
        if (pcVar11 == (char *)0x0) goto LAB_0028ca97;
        smeta = (smeta->d).superdata.direct;
      } while (smeta != (QMetaObject *)0x0);
      if (bVar5) {
LAB_0028ca97:
        if (!(bool)(pbVar10 == (byte *)0x0 | bVar1)) {
          err_method_notfound(receiver,method,"disconnect");
          err_info_about_objects("disconnect",sender,receiver);
        }
        if ((pcVar11 == (char *)0x0) && (bVar4 != false)) {
          (*sender->_vptr_QObject[0xb])();
          bVar4 = true;
        }
      }
      else {
        err_method_notfound(sender,signal,"disconnect");
        err_info_about_objects("disconnect",sender,receiver);
      }
      QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray
                ((QVarLengthArray<QArgumentType,_10LL> *)local_2f0);
      QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray
                ((QVarLengthArray<QArgumentType,_10LL> *)local_198);
    }
    else {
      QMetaObject::normalizedSignature((QByteArray *)local_198,method);
      pDVar2 = (Data *)CONCAT44(local_198._4_4_,local_198._0_4_);
      pbVar10 = (byte *)CONCAT44(local_198._12_4_,local_198._8_4_);
      local_198._0_4_ = SUB84(local_328.d,0);
      local_198._4_4_ = (undefined4)((ulong)local_328.d >> 0x20);
      local_198._8_4_ = SUB84(local_328.ptr,0);
      local_198._12_4_ = (undefined4)((ulong)local_328.ptr >> 0x20);
      qVar3 = CONCAT44(local_198._20_4_,local_198._16_4_);
      local_198._16_4_ = (undefined4)local_328.size;
      local_198._20_4_ = (undefined4)((ulong)local_328.size >> 0x20);
      local_328.d = pDVar2;
      local_328.ptr = (char *)pbVar10;
      local_328.size = qVar3;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_198);
      method_00 = local_328.ptr;
      if ((byte *)local_328.ptr == (byte *)0x0) {
        method_00 = &QByteArray::_empty;
      }
      bVar4 = check_method_code((byte)*method_00 & 3,receiver,method_00,"disconnect");
      if (bVar4) {
        pbVar10 = (byte *)method_00 + 1;
        goto LAB_0028c832;
      }
      bVar4 = false;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_328);
  }
  else {
    QMetaObject::normalizedSignature((QByteArray *)local_198,signal);
    pDVar2 = (Data *)CONCAT44(local_198._4_4_,local_198._0_4_);
    pcVar11 = (char *)CONCAT44(local_198._12_4_,local_198._8_4_);
    local_198._0_4_ = SUB84(local_308.d,0);
    local_198._4_4_ = (undefined4)((ulong)local_308.d >> 0x20);
    local_198._8_4_ = SUB84(local_308.ptr,0);
    local_198._12_4_ = (undefined4)((ulong)local_308.ptr >> 0x20);
    qVar3 = CONCAT44(local_198._20_4_,local_198._16_4_);
    local_198._16_4_ = (undefined4)local_308.size;
    local_198._20_4_ = (undefined4)((ulong)local_308.size >> 0x20);
    local_308.d = pDVar2;
    local_308.ptr = pcVar11;
    local_308.size = qVar3;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_198);
    pcVar11 = local_308.ptr;
    if (local_308.ptr == (char *)0x0) {
      pcVar11 = &QByteArray::_empty;
    }
    bVar4 = check_signal_macro(sender,pcVar11,"disconnect","unbind");
    if (bVar4) {
      pcVar11 = pcVar11 + 1;
      goto LAB_0028c78a;
    }
    bVar4 = false;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_308);
LAB_0028cb50:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QObject::disconnect(const QObject *sender, const char *signal,
                         const QObject *receiver, const char *method)
{
    if (sender == nullptr || (receiver == nullptr && method != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    const char *signal_arg = signal;
    QByteArray signal_name;
    bool signal_found = false;
    if (signal) {
        QT_TRY {
            signal_name = QMetaObject::normalizedSignature(signal);
            signal = signal_name.constData();
        } QT_CATCH (const std::bad_alloc &) {
            // if the signal is already normalized, we can continue.
            if (sender->metaObject()->indexOfSignal(signal + 1) == -1)
                QT_RETHROW;
        }

        if (!check_signal_macro(sender, signal, "disconnect", "unbind"))
            return false;
        signal++; // skip code
    }